

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestDepfileOverride::Run(GraphTestDepfileOverride *this)

{
  Test *this_00;
  int iVar1;
  bool condition;
  int iVar2;
  Node *this_01;
  Edge *this_02;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Edge *local_28;
  Edge *edge;
  int local_14;
  GraphTestDepfileOverride *pGStack_10;
  int fail_count;
  GraphTestDepfileOverride *this_local;
  
  pGStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&edge + 4));
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  depfile = x\n  command = unused\nbuild out: r in\n  depfile = y\n",
              stack0xffffffffffffffe4);
  iVar1 = local_14;
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  if (iVar1 == iVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out",&local_49);
    this_01 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_48);
    this_02 = Node::in_edge(this_01);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_00 = g_current_test;
    local_28 = this_02;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"depfile",&local_a1);
    Edge::GetBinding(&local_80,this_02,&local_a0);
    condition = std::operator==("y",&local_80);
    testing::Test::Check
              (this_00,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x127,"\"y\" == edge->GetBinding(\"depfile\")");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(GraphTest, DepfileOverride) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule r\n"
"  depfile = x\n"
"  command = unused\n"
"build out: r in\n"
"  depfile = y\n"));
  Edge* edge = GetNode("out")->in_edge();
  EXPECT_EQ("y", edge->GetBinding("depfile"));
}